

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O1

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Insert
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  int iVar1;
  uint uVar2;
  Node *pNVar3;
  __pointer_type pNVar4;
  long lVar5;
  ulong uVar6;
  Node *prev [12];
  Node *local_78 [12];
  
  pNVar3 = FindGreaterOrEqual(this,key,local_78);
  if (pNVar3 != (Node *)0x0) {
    iVar1 = MemTable::KeyComparator::operator()(&this->compare_,*key,pNVar3->key);
    if (iVar1 == 0) {
      __assert_fail("x == nullptr || !Equal(key, x->key)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/skiplist.h"
                    ,0x158,
                    "void leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Insert(const Key &) [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                   );
    }
  }
  uVar2 = RandomHeight(this);
  if ((this->max_height_).super___atomic_base<int>._M_i < (int)uVar2) {
    iVar1 = (this->max_height_).super___atomic_base<int>._M_i;
    if (iVar1 < (int)uVar2) {
      lVar5 = (long)iVar1;
      pNVar3 = this->head_;
      do {
        local_78[lVar5] = pNVar3;
        lVar5 = lVar5 + 1;
      } while ((int)uVar2 != lVar5);
    }
    (this->max_height_).super___atomic_base<int>._M_i = uVar2;
  }
  pNVar4 = (__pointer_type)Arena::AllocateAligned(this->arena_,(long)(int)uVar2 * 8 + 8);
  pNVar4->key = *key;
  if (0 < (int)uVar2) {
    uVar6 = 0;
    do {
      pNVar4->next_[uVar6] =
           (atomic<leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Node_*>)
           local_78[uVar6]->next_[uVar6]._M_b._M_p;
      local_78[uVar6]->next_[uVar6]._M_b._M_p = pNVar4;
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  return;
}

Assistant:

void SkipList<Key, Comparator>::Insert(const Key& key) {
  // TODO(opt): We can use a barrier-free variant of FindGreaterOrEqual()
  // here since Insert() is externally synchronized.
  Node* prev[kMaxHeight];
  Node* x = FindGreaterOrEqual(key, prev);

  // Our data structure does not allow duplicate insertion
  assert(x == nullptr || !Equal(key, x->key));

  int height = RandomHeight();
  if (height > GetMaxHeight()) {
    for (int i = GetMaxHeight(); i < height; i++) {
      prev[i] = head_;
    }
    // It is ok to mutate max_height_ without any synchronization
    // with concurrent readers.  A concurrent reader that observes
    // the new value of max_height_ will see either the old value of
    // new level pointers from head_ (nullptr), or a new value set in
    // the loop below.  In the former case the reader will
    // immediately drop to the next level since nullptr sorts after all
    // keys.  In the latter case the reader will use the new node.
    max_height_.store(height, std::memory_order_relaxed);
  }

  x = NewNode(key, height);
  for (int i = 0; i < height; i++) {
    // NoBarrier_SetNext() suffices since we will add a barrier when
    // we publish a pointer to "x" in prev[i].
    x->NoBarrier_SetNext(i, prev[i]->NoBarrier_Next(i));
    prev[i]->SetNext(i, x);
  }
}